

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborContainerPrivate::appendAsciiString(QCborContainerPrivate *this,QStringView s)

{
  QFlags<QtCbor::Element::ValueFlag> QVar1;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  uchar *l;
  char *ptr;
  qsizetype len;
  Element e;
  parameter_type t;
  QCborContainerPrivate *this_00;
  QFlagsStorage<QtCbor::Element::ValueFlag> f;
  undefined1 *local_28;
  undefined8 uStack_20;
  QStringView local_18;
  long local_8;
  
  f.i = (Int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QStringView::size(&local_18);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x21c171);
  t = (parameter_type)0x0;
  this_00 = (QCborContainerPrivate *)&local_28;
  QtCbor::Element::Element((Element *)this_00,0,Integer,(ValueFlags)f.i);
  local_28 = (undefined1 *)addByteData(this_00,(char *)t,0x21c1a4);
  uStack_20 = (undefined1 *)CONCAT44(uStack_20._4_4_,0x60);
  QVar1 = QtCbor::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
  uStack_20 = (undefined1 *)
              CONCAT44(QVar1.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
                       super_QFlagsStorage<QtCbor::Element::ValueFlag>.i,(undefined4)uStack_20);
  QList<QtCbor::Element>::append((QList<QtCbor::Element> *)this_00,t);
  QByteArray::data((QByteArray *)this_00);
  QStringView::utf16(&local_18);
  qt_to_latin1_unchecked((uchar *)this_00,(char16_t *)t,0x21c22c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void QCborContainerPrivate::appendAsciiString(QStringView s)
{
    qsizetype len = s.size();
    QtCbor::Element e;
    e.value = addByteData(nullptr, len);
    e.type = QCborValue::String;
    e.flags = Element::HasByteData | Element::StringIsAscii;
    elements.append(e);

    char *ptr = data.data() + e.value + sizeof(ByteData);
    uchar *l = reinterpret_cast<uchar *>(ptr);
    qt_to_latin1_unchecked(l, s.utf16(), len);
}